

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O1

bool dxil_spv::wmma_store_is_masked(Impl *impl,StoreInst *inst)

{
  ulong uVar1;
  Value *pVVar2;
  _Hash_node_base *p_Var3;
  __hash_code __code;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  pVVar2 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,0);
  uVar1 = (impl->ags).coopmat_component_mapping._M_h._M_bucket_count;
  uVar4 = (ulong)pVVar2 % uVar1;
  p_Var5 = (impl->ags).coopmat_component_mapping._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5, pVVar2 != (Value *)p_Var5->_M_nxt[1]._M_nxt)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, pVVar2 == (Value *)p_Var3[1]._M_nxt)) goto LAB_0017c699;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0017c699:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if ((p_Var3 != (_Hash_node_base *)0x0) && (*(int *)((long)&p_Var3[2]._M_nxt + 4) != 0)) {
    pVVar2 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
    uVar1 = (impl->ags).coopmat_component_mapping._M_h._M_bucket_count;
    uVar4 = (ulong)pVVar2 % uVar1;
    p_Var5 = (impl->ags).coopmat_component_mapping._M_h._M_buckets[uVar4];
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5, pVVar2 != (Value *)p_Var5->_M_nxt[1]._M_nxt)) {
      while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var6 = p_Var5, pVVar2 == (Value *)p_Var3[1]._M_nxt)) goto LAB_0017c725;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_0017c725:
    if (p_Var6 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var6->_M_nxt;
    }
    if (p_Var3 != (_Hash_node_base *)0x0) {
      return *(int *)((long)&p_Var3[2]._M_nxt + 4) != 0;
    }
  }
  return false;
}

Assistant:

bool wmma_store_is_masked(Converter::Impl &impl, const llvm::StoreInst *inst)
{
	auto itr = impl.ags.coopmat_component_mapping.find(inst->getOperand(0));
	if (itr == impl.ags.coopmat_component_mapping.end() || itr->second.component == 0)
		return false;

	itr = impl.ags.coopmat_component_mapping.find(inst->getOperand(1));
	if (itr == impl.ags.coopmat_component_mapping.end() || itr->second.component == 0)
		return false;

	return true;
}